

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DHMap.hpp
# Opt level: O0

Entry * __thiscall
Lib::
DHMap<std::pair<unsigned_int,_unsigned_int>,_Kernel::Term_*,_Lib::DefaultHash,_Lib::DefaultHash2>::
findEntryToInsert(DHMap<std::pair<unsigned_int,_unsigned_int>,_Kernel::Term_*,_Lib::DefaultHash,_Lib::DefaultHash2>
                  *this,pair<unsigned_int,_unsigned_int> *key)

{
  bool bVar1;
  pair<unsigned_int,_unsigned_int> *in_RSI;
  uint *in_RDI;
  uint h2;
  Entry *res;
  int pos;
  uint h1;
  pair<unsigned_int,_unsigned_int> *in_stack_ffffffffffffffb8;
  uint7 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc7;
  uint local_2c;
  uint local_20;
  Entry *local_8;
  
  ensureExpanded((DHMap<std::pair<unsigned_int,_unsigned_int>,_Kernel::Term_*,_Lib::DefaultHash,_Lib::DefaultHash2>
                  *)CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0));
  local_20 = DefaultHash::hash<unsigned_int,unsigned_int>
                       ((pair<unsigned_int,_unsigned_int> *)
                        CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0));
  local_20 = local_20 % in_RDI[4];
  local_8 = (Entry *)(*(long *)(in_RDI + 6) + (long)(int)local_20 * 0x18);
  if (((uint)(local_8->field_0)._infoData >> 2 == *in_RDI) &&
     (bVar1 = std::operator==(&local_8->_key,in_RSI), !bVar1)) {
    (local_8->field_0)._infoData = (local_8->field_0)._infoData & 0xfffffffdU | 2;
    local_2c = DefaultHash2::hash<unsigned_int,unsigned_int>
                         ((pair<unsigned_int,_unsigned_int> *)
                          CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0));
    local_2c = local_2c % in_RDI[4];
    if (local_2c == 0) {
      local_2c = 1;
    }
    do {
      local_20 = (local_20 + local_2c) % in_RDI[4];
      local_8 = (Entry *)(*(long *)(in_RDI + 6) + (long)(int)local_20 * 0x18);
      bVar1 = false;
      if ((uint)(local_8->field_0)._infoData >> 2 == *in_RDI) {
        bVar1 = std::operator!=((pair<unsigned_int,_unsigned_int> *)(ulong)in_stack_ffffffffffffffc0
                                ,in_stack_ffffffffffffffb8);
      }
    } while (bVar1 != false);
  }
  return local_8;
}

Assistant:

Entry* findEntryToInsert(Key const& key)
  {
    ensureExpanded();
    ASS(_capacity>_size+_deleted);

    unsigned h1=Hash1::hash(key);
    int pos=h1%_capacity;
    Entry* res=&_entries[pos];
    if(res->_info.timestamp != _timestamp || res->_key==key) {
      return res;
    }

    //We have a collision...

    //mark the entry where the collision occured
    res->_info.collision=1;

    unsigned h2=Hash2::hash(key)%_capacity;
    if(h2==0) {
      h2=1;
    }
    do {
      pos=(pos+h2)%_capacity;
      res=&_entries[pos];
    } while (res->_info.timestamp == _timestamp && res->_key!=key);
    return res;
  }